

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O0

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::ReadSOLFile(SOLReader2<mp::SOLHandler_Easy> *this,string *name)

{
  uiolen uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  NLW2_SOLReadResultCode NVar8;
  char *pcVar9;
  size_t sVar10;
  reference pcVar11;
  long lVar12;
  SOLHandler_Easy *pSVar13;
  size_t sVar14;
  SOLReader2<mp::SOLHandler_Easy> *in_RDI;
  double dVar15;
  FILE *in_stack_000001a0;
  SOLReader2<mp::SOLHandler_Easy> *in_stack_000001a8;
  VecReader<double> vr_2;
  VecReader<double> vr_1;
  VecReader<double> vr;
  int rv;
  AMPLOptions ao;
  iterator b;
  FILE *f;
  File file;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  SOLReader2<mp::SOLHandler_Easy> *in_stack_fffffffffffffb60;
  SOLReader2<mp::SOLHandler_Easy> *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  VecReader<double> *in_stack_fffffffffffffb78;
  SOLHandler_Easy *in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  SOLHandler_Easy *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  int local_3d0;
  uiolen local_220;
  allocator<char> local_1d9;
  string local_1d8 [72];
  FILE *in_stack_fffffffffffffe70;
  SOLReader2<mp::SOLHandler_Easy> *in_stack_fffffffffffffe78;
  AMPLOptions local_108;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [39];
  allocator<char> local_59;
  string local_58 [32];
  FILE *local_38;
  uint local_30;
  File local_20 [3];
  NLW2_SOLReadResultCode local_4;
  
  File::File(local_20);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  in_RDI->stub_ = pcVar9;
  File::Open((File *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (char *)in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
  in_RDI->internal_rv_ = 0x3e5;
  bVar3 = File::operator_cast_to_bool(local_20);
  if (!bVar3) {
    serror(in_RDI,"can\'t open \'%s\'",in_RDI->stub_);
    in_RDI->internal_rv_ = 0x3e6;
    local_4 = NLW2_SOLRead_Fail_Open;
    local_30 = 1;
    goto LAB_00126208;
  }
  local_38 = (FILE *)File::GetHandle(local_20);
  sVar10 = fread(&in_RDI->L,4,1,local_38);
  if ((sVar10 == 0) || (in_RDI->L != 6)) {
    in_RDI->binary = 0;
    rewind(local_38);
  }
  else {
    in_RDI->binary = 1;
    sVar10 = fread(in_RDI->buf,6,1,local_38);
    if ((((sVar10 == 0) || (iVar5 = strncmp(in_RDI->buf,"binary",6), iVar5 != 0)) ||
        (sVar10 = fread(&in_RDI->L,4,1,local_38), sVar10 == 0)) || (in_RDI->L != 6)) {
      local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      local_30 = 1;
      goto LAB_00126208;
    }
  }
  in_RDI->need_vbtol = 0;
  in_RDI->have_options = 0;
  in_RDI->bs = 1;
  in_RDI->nbs = 0;
  if (in_RDI->binary == 0) {
LAB_0012475e:
    pcVar9 = fgets(in_RDI->buf,0x200,local_38);
    if (pcVar9 == (char *)0x0) goto code_r0x00124797;
    in_RDI->se = in_RDI->buf;
    while (*in_RDI->se != '\0') {
      if ((*in_RDI->se == '\r') && (in_RDI->se[1] == '\n')) {
        *in_RDI->se = '\n';
        pcVar9 = in_RDI->se;
        in_RDI->se = pcVar9 + 1;
        pcVar9[1] = '\0';
        break;
      }
      in_RDI->se = in_RDI->se + 1;
    }
    if (in_RDI->buf[0] != '\n') {
      in_RDI->n1 = (long)in_RDI->se - (long)in_RDI->buf;
      in_RDI->b1 = in_RDI->buf;
      if ((in_RDI->buf[0] == '\b') && (in_RDI->bs != 0)) goto code_r0x001248e7;
      goto LAB_001249ac;
    }
    do {
      iVar5 = getc(local_38);
      in_RDI->j = iVar5;
      bVar3 = true;
      if (iVar5 != 10) {
        bVar3 = in_RDI->j == 0xd;
      }
    } while (bVar3);
    if (in_RDI->j == 0x4f) {
      pcVar9 = fgets(in_RDI->buf,0x200,local_38);
      if (pcVar9 == (char *)0x0) {
        local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
        local_30 = 1;
        goto LAB_00126208;
      }
      iVar5 = strncmp(in_RDI->buf,"ptions",6);
      if (iVar5 == 0) {
        in_RDI->have_options = 1;
        in_RDI->j = 0;
        while (in_RDI->j < 4) {
          pcVar9 = fgets(in_RDI->buf,0x200,local_38);
          if (pcVar9 == (char *)0x0) {
            local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
            local_30 = 1;
            goto LAB_00126208;
          }
          lVar12 = strtol(in_RDI->buf,&in_RDI->se,10);
          in_RDI->Options[in_RDI->j] = (Long)lVar12;
          if (in_RDI->se == in_RDI->buf) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
            local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                                    CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                    (string *)in_stack_fffffffffffffb68);
            std::__cxx11::string::~string(local_58);
            std::allocator<char>::~allocator(&local_59);
            local_30 = 1;
            goto LAB_00126208;
          }
          in_RDI->j = in_RDI->j + 1;
        }
        in_RDI->nOpts = in_RDI->Options[0];
        if ((in_RDI->nOpts < 3) || (9 < in_RDI->nOpts)) {
LAB_001244ed:
          serror(in_RDI,"expected nOpts between 3 and 9; got %d: ",(ulong)(uint)in_RDI->nOpts);
          local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                    CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          local_30 = 1;
          goto LAB_00126208;
        }
        if (in_RDI->Options[2] == 3) {
          in_RDI->nOpts = in_RDI->nOpts + -2;
          in_RDI->need_vbtol = 1;
        }
        in_RDI->je = in_RDI->nOpts + 5;
        in_RDI->j = 4;
        while (in_RDI->j < in_RDI->je) {
          pcVar9 = fgets(in_RDI->buf,0x200,local_38);
          if (pcVar9 == (char *)0x0) {
            local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
            local_30 = 1;
            goto LAB_00126208;
          }
          lVar12 = strtol(in_RDI->buf,&in_RDI->se,10);
          in_RDI->Options[in_RDI->j] = (Long)lVar12;
          if (in_RDI->se == in_RDI->buf) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
            local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                                    CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                    (string *)in_stack_fffffffffffffb68);
            std::__cxx11::string::~string(local_80);
            std::allocator<char>::~allocator(&local_81);
            local_30 = 1;
            goto LAB_00126208;
          }
          in_RDI->j = in_RDI->j + 1;
        }
        if (in_RDI->need_vbtol != 0) {
          pcVar9 = fgets(in_RDI->buf,0x200,local_38);
          if (pcVar9 == (char *)0x0) {
            local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
            local_30 = 1;
            goto LAB_00126208;
          }
          dVar15 = strtod(in_RDI->buf,&in_RDI->se);
          in_RDI->vbtol = dVar15;
          if (in_RDI->se == in_RDI->buf) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                       (allocator<char> *)
                       CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
            local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                                    CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                    (string *)in_stack_fffffffffffffb68);
            std::__cxx11::string::~string(local_a8);
            std::allocator<char>::~allocator(&local_a9);
            local_30 = 1;
            goto LAB_00126208;
          }
        }
      }
    }
    else {
      ungetc(in_RDI->j,local_38);
    }
  }
  else {
    do {
      sVar10 = fread(&in_RDI->L,4,1,local_38);
      if (sVar10 == 0) {
        local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
        local_30 = 1;
        goto LAB_00126208;
      }
      uVar1 = in_RDI->L;
      in_RDI->L1 = uVar1;
      while (uVar1 != 0) {
        if (in_RDI->L < 0x200) {
          local_220 = in_RDI->L;
        }
        else {
          local_220 = 0x200;
        }
        in_RDI->n = (long)(int)local_220;
        in_RDI->L = in_RDI->L - (int)in_RDI->n;
        sVar10 = fread(in_RDI->buf,in_RDI->n,1,local_38);
        if (sVar10 == 0) {
          local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
          local_30 = 1;
          goto LAB_00126208;
        }
        if (in_RDI->L == 0) {
          do {
            if (in_RDI->n == 0) goto LAB_00124098;
            sVar14 = in_RDI->n;
            in_RDI->n = sVar14 - 1;
          } while (in_RDI->buf[sVar14 - 1] == ' ');
          in_RDI->n = in_RDI->n + 1;
        }
LAB_00124098:
        in_RDI->b1 = in_RDI->buf;
        in_RDI->n1 = in_RDI->n;
        if ((in_RDI->buf[0] == '\b') && (in_RDI->bs != 0)) {
          do {
            sVar14 = in_RDI->n1 - 1;
            in_RDI->n1 = sVar14;
            bVar3 = false;
            if (sVar14 != 0) {
              pcVar9 = in_RDI->b1;
              in_RDI->b1 = pcVar9 + 1;
              bVar3 = pcVar9[1] == '\b';
            }
          } while (bVar3);
          in_RDI->nbs = (in_RDI->n - in_RDI->n1) + in_RDI->nbs;
          if (in_RDI->n1 != 0) {
            in_RDI->bs = 0;
            goto LAB_00124192;
          }
        }
        else {
LAB_00124192:
          std::__cxx11::string::append((char *)&in_RDI->solve_msg_,(ulong)in_RDI->b1);
        }
        uVar1 = in_RDI->L;
      }
      sVar10 = fread(&in_RDI->L,4,1,local_38);
      if (sVar10 == 0) {
        local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
        local_30 = 1;
        goto LAB_00126208;
      }
      if (in_RDI->L != in_RDI->L1) {
        local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_30 = 1;
        goto LAB_00126208;
      }
    } while (in_RDI->L != 0);
    iVar5 = NumAlgCons((SOLReader2<mp::SOLHandler_Easy> *)0x1242b3);
    in_RDI->L1 = iVar5 << 3;
    sVar10 = fread(&in_RDI->L,4,1,local_38);
    if (sVar10 == 0) {
      local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
      local_30 = 1;
      goto LAB_00126208;
    }
    in_RDI->L2 = in_RDI->L - 0x27;
    if ((in_RDI->L2 < 0x19) && ((in_RDI->L2 & 3) == 0)) {
      sVar10 = fread(in_RDI->buf,7,1,local_38);
      if (sVar10 == 0) {
        local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
        local_30 = 1;
        goto LAB_00126208;
      }
      iVar5 = strncmp(in_RDI->buf,"Options",7);
      if (iVar5 != 0) {
        local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_30 = 1;
        goto LAB_00126208;
      }
      sVar10 = fread(in_RDI->Options,4,4,local_38);
      if (sVar10 == 0) {
        local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
        local_30 = 1;
        goto LAB_00126208;
      }
      in_RDI->nOpts = in_RDI->Options[0];
      if ((in_RDI->nOpts < 3) || (9 < in_RDI->nOpts)) goto LAB_001244ed;
      if (in_RDI->Options[2] == 3) {
        in_RDI->nOpts = in_RDI->nOpts + -2;
        in_RDI->need_vbtol = 1;
      }
      sVar10 = fread(in_RDI->Options + 4,4,(long)(in_RDI->nOpts + 1),local_38);
      if (sVar10 == 0) {
        local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
        local_30 = 1;
        goto LAB_00126208;
      }
      if ((in_RDI->need_vbtol != 0) && (sVar10 = fread(&in_RDI->vbtol,8,1,local_38), sVar10 == 0)) {
        local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
        local_30 = 1;
        goto LAB_00126208;
      }
      sVar10 = fread(&in_RDI->L2,4,1,local_38);
      if ((sVar10 == 0) || (in_RDI->L != in_RDI->L2)) {
        local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_30 = 1;
        goto LAB_00126208;
      }
      in_RDI->have_options = 1;
    }
    else if (in_RDI->L != in_RDI->L1) {
      local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      local_30 = 1;
      goto LAB_00126208;
    }
  }
  if (in_RDI->nbs != 0) {
    local_b8._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_c0 = std::__cxx11::string::end();
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffb60,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      bVar3 = false;
      if (bVar4) {
        pcVar11 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_b8);
        bVar3 = *pcVar11 == '\b';
      }
      if (!bVar3) break;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_b8);
    }
    local_d0 = std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffb60,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffb60,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_e0 = std::__cxx11::string::erase(&in_RDI->solve_msg_,local_c8,local_d8);
  }
  lVar12 = std::__cxx11::string::size();
  if (lVar12 != 0) {
    if (in_RDI->binary != 0) {
      std::__cxx11::string::operator+=((string *)&in_RDI->solve_msg_,"\n");
    }
    Handler(in_RDI);
    std::__cxx11::string::c_str();
    SOLHandler_Easy::OnSolveMessage
              ((SOLHandler_Easy *)in_stack_fffffffffffffb60,
               (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0);
  }
  if (in_RDI->have_options == 0) {
    iVar5 = NumAlgCons((SOLReader2<mp::SOLHandler_Easy> *)0x125701);
    in_RDI->j = iVar5;
  }
  else {
    in_RDI->z = in_RDI->Options + (long)in_RDI->nOpts + 1;
    in_RDI->internal_rv_ = 0x3e4;
    SOLHandler::AMPLOptions::AMPLOptions((AMPLOptions *)0x12534b);
    std::vector<long,std::allocator<long>>::assign<int*,void>
              ((vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (int *)in_stack_fffffffffffffb68,(int *)in_stack_fffffffffffffb60);
    local_108.has_vbtol_ = in_RDI->need_vbtol != 0;
    local_108.vbtol_ = in_RDI->vbtol;
    pSVar13 = Handler(in_RDI);
    iVar5 = SOLHandler::OnAMPLOptions((SOLHandler *)pSVar13,&local_108);
    if (iVar5 == 0) {
      in_RDI->j = in_RDI->z[3];
      in_RDI->internal_rv_ = 0x3e5;
      iVar5 = in_RDI->j;
      iVar6 = NumVars((SOLReader2<mp::SOLHandler_Easy> *)0x125471);
      if ((iVar6 < iVar5) || (in_RDI->j < 0)) {
        uVar2 = in_RDI->j;
        uVar7 = NumVars((SOLReader2<mp::SOLHandler_Easy> *)0x1254b7);
        serror(in_RDI,"Wrong NumVars %d, expected 0..%d: ",(ulong)uVar2,(ulong)uVar7);
        local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_30 = 1;
      }
      else {
        in_RDI->j = in_RDI->z[1];
        iVar5 = in_RDI->j;
        iVar6 = NumAlgCons((SOLReader2<mp::SOLHandler_Easy> *)0x125544);
        if ((iVar6 < iVar5) || (in_RDI->j < 0)) {
          uVar2 = in_RDI->j;
          uVar7 = NumAlgCons((SOLReader2<mp::SOLHandler_Easy> *)0x12558a);
          serror(in_RDI,"Wrong NumAlgCons %d, expected 0..%d: ",(ulong)uVar2,(ulong)uVar7);
          local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                    CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          local_30 = 1;
        }
        else if (in_RDI->binary == 0) {
LAB_001256c9:
          local_30 = 0;
        }
        else {
          in_RDI->L1 = in_RDI->j << 3;
          sVar10 = fread(&in_RDI->L,4,1,local_38);
          if (sVar10 == 0) {
            local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
            local_30 = 1;
          }
          else {
            if (in_RDI->L == in_RDI->L1) goto LAB_001256c9;
            local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                      CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70))
            ;
            local_30 = 1;
          }
        }
      }
    }
    else {
      in_RDI->internal_rv_ = iVar5;
      local_4 = NLW2_SOLRead_Bad_Options;
      local_30 = 1;
    }
    SOLHandler::AMPLOptions::~AMPLOptions((AMPLOptions *)0x1256e1);
    if (local_30 != 0) goto LAB_00126208;
  }
  if (in_RDI->j != 0) {
    VecReader<double>::VecReader
              ((VecReader<double> *)in_stack_fffffffffffffb60,
               (FILE *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0,0x12575d);
    Handler(in_RDI);
    SOLHandler_Easy::OnDualSolution<mp::VecReader<double>>
              ((SOLHandler_Easy *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (VecReader<double> *)in_stack_fffffffffffffb68);
    bVar3 = CheckReader<mp::VecReader<double>>
                      (in_stack_fffffffffffffb68,(VecReader<double> *)in_stack_fffffffffffffb60,
                       (NLW2_SOLReadResultCode *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    if (!bVar3) {
      local_4 = in_RDI->readresult_;
    }
    local_30 = (uint)!bVar3;
    VecReader<double>::~VecReader((VecReader<double> *)0x125822);
    if (local_30 != 0) goto LAB_00126208;
  }
  if (in_RDI->have_options == 0) {
    local_3d0 = NumVars((SOLReader2<mp::SOLHandler_Easy> *)0x12586e);
  }
  else {
    local_3d0 = in_RDI->z[3];
  }
  in_RDI->nsv = local_3d0;
  in_RDI->i = local_3d0;
  in_RDI->sstatus_seen = 0;
  if (in_RDI->binary == 0) {
    if (in_RDI->i != 0) {
      VecReader<double>::VecReader
                ((VecReader<double> *)in_stack_fffffffffffffb60,
                 (FILE *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0,0x125e70);
      in_stack_fffffffffffffb98 = Handler(in_RDI);
      SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      in_stack_fffffffffffffb97 =
           CheckReader<mp::VecReader<double>>
                     (in_stack_fffffffffffffb68,(VecReader<double> *)in_stack_fffffffffffffb60,
                      (NLW2_SOLReadResultCode *)
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      if (!(bool)in_stack_fffffffffffffb97) {
        local_4 = in_RDI->readresult_;
      }
      local_30 = (uint)!(bool)in_stack_fffffffffffffb97;
      VecReader<double>::~VecReader((VecReader<double> *)0x125f29);
      if (local_30 != 0) goto LAB_00126208;
    }
    pcVar9 = fgets(in_RDI->buf,0x200,local_38);
    if (pcVar9 != (char *)0x0) {
      iVar5 = strncmp(in_RDI->buf,"objno ",6);
      if (iVar5 == 0) {
        in_RDI->s = in_RDI->buf + 6;
        dVar15 = strtod(in_RDI->buf + 6,&in_RDI->se);
        in_RDI->x = dVar15;
        if (in_RDI->s < in_RDI->se) {
          in_RDI->objno = (int)in_RDI->x;
          in_RDI->s = in_RDI->se;
          dVar15 = strtod(in_RDI->se,&in_RDI->se);
          in_RDI->x = dVar15;
          if (in_RDI->s < in_RDI->se) {
            in_RDI->Objno[1] = (int)in_RDI->x;
            pSVar13 = Handler(in_RDI);
            SOLHandler::OnObjno((SOLHandler *)pSVar13,in_RDI->objno);
            pSVar13 = Handler(in_RDI);
            SOLHandler_Easy::OnSolveCode(pSVar13,in_RDI->Objno[1]);
            NVar8 = gsufread(in_stack_000001a8,in_stack_000001a0);
            if (NVar8 != NLW2_SOLRead_OK) {
              if (NVar8 != NLW2_SOLRead_Bad_Suffix) {
                local_4 = in_RDI->readresult_;
                local_30 = 1;
                goto LAB_00126208;
              }
LAB_00125d8c:
              serror(in_RDI,"Bad suffix in \'%s\'\n",in_RDI->stub_);
              local_4 = NLW2_SOLRead_Bad_Suffix;
              local_30 = 1;
              goto LAB_00126208;
            }
          }
          goto LAB_001261e0;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
      local_4 = ReportBadLine((SOLReader2<mp::SOLHandler_Easy> *)
                              CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                              (string *)in_stack_fffffffffffffb68);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      local_30 = 1;
      goto LAB_00126208;
    }
  }
  else {
    sVar10 = fread(&in_RDI->L,4,1,local_38);
    if ((sVar10 == 0) || (in_RDI->L != in_RDI->L1)) {
      local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      local_30 = 1;
      goto LAB_00126208;
    }
    in_RDI->L1 = in_RDI->i << 3;
    sVar10 = fread(&in_RDI->L,4,1,local_38);
    if ((sVar10 == 0) || (in_RDI->L != in_RDI->L1)) {
      local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      local_30 = 1;
      goto LAB_00126208;
    }
    if (in_RDI->i != 0) {
      VecReader<double>::VecReader
                ((VecReader<double> *)in_stack_fffffffffffffb60,
                 (FILE *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0,0x125a16);
      Handler(in_RDI);
      SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      bVar3 = CheckReader<mp::VecReader<double>>
                        (in_stack_fffffffffffffb68,(VecReader<double> *)in_stack_fffffffffffffb60,
                         (NLW2_SOLReadResultCode *)
                         CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      if (!bVar3) {
        local_4 = in_RDI->readresult_;
      }
      local_30 = (uint)!bVar3;
      VecReader<double>::~VecReader((VecReader<double> *)0x125adb);
      if (local_30 != 0) goto LAB_00126208;
    }
    sVar10 = fread(&in_RDI->L,4,1,local_38);
    if ((sVar10 == 0) || (in_RDI->L != in_RDI->L1)) {
      local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      local_30 = 1;
      goto LAB_00126208;
    }
    sVar10 = fread(&in_RDI->L,4,1,local_38);
    if (sVar10 != 0) {
      if ((in_RDI->L != 8) && (in_RDI->L != 4)) {
        local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_30 = 1;
        goto LAB_00126208;
      }
      in_RDI->ui = (ulong)in_RDI->L;
      sVar10 = fread(in_RDI->Objno,in_RDI->ui,1,local_38);
      if (((sVar10 != 1) || (sVar10 = fread(&in_RDI->L1,4,1,local_38), sVar10 != 1)) ||
         (in_RDI->L != in_RDI->L1)) {
        local_4 = ReportBadFormat((SOLReader2<mp::SOLHandler_Easy> *)
                                  CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
        local_30 = 1;
        goto LAB_00126208;
      }
      in_RDI->objno = in_RDI->Objno[0];
      pSVar13 = Handler(in_RDI);
      SOLHandler::OnObjno((SOLHandler *)pSVar13,in_RDI->objno);
      pSVar13 = Handler(in_RDI);
      SOLHandler_Easy::OnSolveCode(pSVar13,in_RDI->Objno[1]);
      if ((in_RDI->L == 8) &&
         (NVar8 = bsufread(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70),
         NVar8 != NLW2_SOLRead_OK)) {
        if (NVar8 != NLW2_SOLRead_Bad_Suffix) {
          local_4 = in_RDI->readresult_;
          local_30 = 1;
          goto LAB_00126208;
        }
        goto LAB_00125d8c;
      }
      do {
        sVar10 = fread(&in_RDI->L,4,1,local_38);
      } while (sVar10 != 0);
    }
  }
LAB_001261e0:
  in_RDI->internal_rv_ = 0;
  local_4 = NLW2_SOLRead_OK;
  local_30 = 1;
LAB_00126208:
  File::~File((File *)0x126215);
  return local_4;
code_r0x00124797:
  local_4 = ReportEarlyEof(in_stack_fffffffffffffb60);
  local_30 = 1;
  goto LAB_00126208;
code_r0x001248e7:
  in_RDI->n = in_RDI->n1;
  do {
    sVar14 = in_RDI->n1 - 1;
    in_RDI->n1 = sVar14;
    bVar3 = false;
    if (sVar14 != 0) {
      pcVar9 = in_RDI->b1;
      in_RDI->b1 = pcVar9 + 1;
      bVar3 = pcVar9[1] == '\b';
    }
  } while (bVar3);
  in_RDI->nbs = (in_RDI->n - in_RDI->n1) + in_RDI->nbs;
  if (in_RDI->n1 != 0) {
    in_RDI->bs = 0;
LAB_001249ac:
    std::__cxx11::string::append((char *)&in_RDI->solve_msg_,(ulong)in_RDI->b1);
  }
  goto LAB_0012475e;
}

Assistant:

NLW2_SOLReadResultCode
SOLReader2<SOLHandler>::ReadSOLFile(
    const std::string& name) {
  File file;
  stub_ = name.c_str();

  file.Open(stub_, "rb");
  internal_rv_ = 997;
  if (!file) {
    serror("can't open '%s'", stub_);
    internal_rv_ = 998;
    return NLW2_SOLRead_Fail_Open;
  }
  FILE* f = file.GetHandle();
  if (fread((char *)&L, sizeof(uiolen), 1, f)
      && L == 6) {
    /* binary files may be written by Fortran unformatted writes */
    binary = 1;
    if (!fread(buf, 6, 1, f)
        || strncmp(buf,"binary",6)
        || !fread((char *)&L, sizeof(uiolen), 1, f)
        || L != 6) {
      return ReportBadFormat();
    }
  }
  else {
    binary = 0;
    rewind(f);
  }
  have_options = need_vbtol = 0;
  bs = 1;	/* omit initial backspaces */
  nbs = 0; /* number of backspaces omitted */
  if (binary) {     /////////////// BINARY FORMAT //////////
    for(;;) {       /////////////// SOLVE MESSAGE //////////
      if (!fread((char *)&L,sizeof(uiolen),1,f))
        return ReportEarlyEof();
      if ((L1 = L)) {
        do {
          n = L < sizeof(buf) ? (int)L : (int)sizeof(buf);
          L -= n;
          if (!fread(buf, n, 1, f))
            return ReportEarlyEof();
          if (!L) {
            while(n > 0) {
              if (buf[--n] != ' ') {
                ++n;
                break;
              }
            }
          }
          b1 = buf;
          n1 = n;
          if (buf[0] == '\b' && bs) {
            while(--n1 > 0
                  && *++b1 == '\b');
            nbs += n - n1;
            if (n1 > 0)
              bs = 0;
            else
              continue;
          }
          solve_msg_.append(b1, n1);
        }
        while(L);
      }
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
      if (!L)
        break;
    }
		L1 = NumAlgCons() * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f))
      return ReportEarlyEof();
    L2 = L - (8*sizeof(Long) + 7);
    if (L2 <= 4*sizeof(Long) + sizeof(real)
        && !(L2 & (sizeof(Long)-1))) {
      /////////////// check for Options ///////////////
      if (!fread(buf, 7, 1, f))
        return ReportEarlyEof();
      if (strncmp(buf, "Options", 7))
        return ReportBadFormat();
      if (!fread((char *)Options, sizeof(Long), 4, f))
        return ReportEarlyEof();
      nOpts = Options[0];
      if (nOpts < 3 || nOpts > 9) {
bad_nOpts:
        serror(
              "expected nOpts between 3 and 9; got %d: ",
              nOpts);
        return ReportBadFormat();
      }
      if (Options[2] == 3) {
        nOpts -= 2;
        need_vbtol = 1;
      }
      if (!fread((char *)(Options+4), sizeof(Long),
                 (size_t)(nOpts+1), f))
        return ReportEarlyEof();
      if (need_vbtol
          && !fread((char *)&vbtol, sizeof(real), 1, f))
        return ReportEarlyEof();
      if (!fread((char *)&L2, sizeof(uiolen), 1, f)
          || L != L2)
        return ReportBadFormat();
      have_options = 1;
    }
    else if (L != L1)
      return ReportBadFormat();
  }
  else {         ///////////////// TEXT FORMAT ///////////////
    for(;;) {    ///////////////// SOLVE MESSAGE /////////////
      if (!fgets(buf, sizeof(buf), f)) {
        return ReportEarlyEof();
      }
      for(se = buf; *se; se++)
        if (*se == '\r' && se[1] == '\n') {
          *se = '\n';
          *++se = 0;
          break;
        }
      if (*buf == '\n')
        break;
      n1 = se - buf;
      b1 = buf;
      if (buf[0] == '\b' && bs) {
        n = n1;
        while(--n1 > 0 && *++b1 == '\b');
        nbs += n - n1;
        if (n1 > 0)
          bs = 0;
        else
          continue;
      }
      solve_msg_.append(b1, n1);
    }
    while((j = getc(f)) == '\n' || j == '\r');
    if (j != 'O')     ////////// Check for Options //////////
      ungetc(j,f);
    else {
      if (!fgets(buf, sizeof(buf), f))
        return ReportEarlyEof();
      if (!strncmp(buf, "ptions", 6)) {
        have_options = 1;
        for(j = 0; j < 4; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        nOpts = Options[0];
        if (nOpts < 3 || nOpts > 9)
          goto bad_nOpts;
        if (Options[2] == 3) {
          nOpts -= 2;
          need_vbtol = 1;
        }
        je = (int)(nOpts+5);
        for(j = 4; j < je; j++) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          Options[j] = (int)strtol(buf,&se,10);
          if (se == buf)
            return ReportBadLine(buf);
        }
        if (need_vbtol) {
          if (!fgets(buf, sizeof(buf), f))
            return ReportEarlyEof();
          vbtol = strtod(buf,&se);
          if (se == buf)
            return ReportBadLine(buf);
        }
      }
    }
  }

  /* send termination msg */
  if (nbs) {
    // Should not have \b here but...
    auto b=solve_msg_.begin();
    while (solve_msg_.end()!=b && '\b'==*b)
      ++b;
    solve_msg_.erase(solve_msg_.begin(), b);
  }
  if (solve_msg_.size()) {
    if (binary)
      solve_msg_ += "\n";
    Handler().OnSolveMessage(
          solve_msg_.c_str(), nbs);
  }

  if (have_options) {
    z = Options + nOpts + 1;
    internal_rv_ = 996;
    // Send options to Handler:
    typename SOLHandler::AMPLOptions ao;
    ao.options_.assign(Options, Options+nOpts+5);
    ao.has_vbtol_ = need_vbtol;
    ao.vbtol_ = vbtol;
    // Handler says we should stop:
    if (auto rv = Handler().OnAMPLOptions(ao)) {
      internal_rv_ = rv;
      return NLW2_SOLRead_Bad_Options;
    }

    // Some checks.
    j = (int)z[3];
    internal_rv_ = 997;
		if (j > NumVars() || j < 0) {
      serror("Wrong NumVars %d, expected 0..%d: ",
						 j, NumVars());
      return ReportBadFormat();
      }
    j = (int)z[1];
		if (j > NumAlgCons() || j < 0) {
      serror("Wrong NumAlgCons %d, expected 0..%d: ",
						 j, NumAlgCons());
      return ReportBadFormat();
      }

    if (binary) {      // read on for binary
      L1 = j * sizeof(real);
      if (!fread((char *)&L, sizeof(uiolen), 1, f))
        return ReportEarlyEof();
      if (L != L1)
        return ReportBadFormat();
    }
  }
	else j = NumAlgCons();

  // Read duals
  if (j) {
    VecReader<double> vr(f, binary, j);
    Handler().OnDualSolution(vr);
    if (!CheckReader( vr, readresult_ ))
      return readresult_;
  }

	i = nsv = have_options ? (int)z[3] : NumVars();
//  objno = ac_->no >= 0 ? 0 : -1;
  sstatus_seen = 0;
  if (binary) {
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();
    L1 = i * sizeof(real);
    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fread((char *)&L, sizeof(uiolen), 1, f) || L != L1)
      return ReportBadFormat();

    /* do we have an objno ? */
    if (fread((char *)&L, sizeof(uiolen), 1, f)) {
      if (L != 2*sizeof(Long) && L != sizeof(integer))
        return ReportBadFormat();
      ui = (size_t) L;
      if (fread(Objno, ui, 1, f) != 1
       || fread(&L1, sizeof(uiolen), 1, f) != 1
       || L != L1)
        return ReportBadFormat();
      objno = (int)Objno[0];

      /* Submit objno and solve_code to Handler. */
      Handler().OnObjno(objno);
      Handler().OnSolveCode(Objno[1]);

      if (L == 2*sizeof(integer)) {
        switch(bsufread(f)) {
        case NLW2_SOLRead_Bad_Suffix:
badsuftable:
          serror("Bad suffix in '%s'\n", stub_);
          return NLW2_SOLRead_Bad_Suffix;
        case NLW2_SOLRead_OK:
          break;
        default:
          return readresult_;
        }
      }
      while(fread(&L, sizeof(uiolen), 1, f)) {}
    }
  }
  else {
    // Read primal solution
    if (i) {
      VecReader<double> vr(f, binary, i);
      Handler().OnPrimalSolution(vr);
      if (!CheckReader( vr, readresult_ ))
        return readresult_;
    }

    if (!fgets(buf,sizeof(buf), f))
      goto f_done;
    if (strncmp(buf,"objno ",6)) {
bad_objno:
      return ReportBadLine(buf);
      }
    x = strtod(s = buf+6, &se);
    if (se <= s)
      goto bad_objno;
    objno = (int)x;
    x = strtod(s = se, &se);
    if (se <= s)
      goto f_done;
    Objno[1] = (Long)x;

    /* Submit objno and solve_code to Handler. */
    Handler().OnObjno(objno);
    Handler().OnSolveCode(Objno[1]);

    switch(gsufread(f)) {
    case NLW2_SOLRead_Bad_Suffix:
      goto badsuftable;
    case NLW2_SOLRead_OK:
      break;
    default:
      return readresult_;
    }
  }
f_done:
  internal_rv_ = 0;
  return NLW2_SOLRead_OK;
}